

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dp.cpp
# Opt level: O1

int si9ma::DP::save_money_dp(int *arr,int length,int index,int target)

{
  ulong uVar1;
  bool bVar2;
  size_t __n;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  undefined4 *puVar7;
  undefined4 *__s;
  undefined4 *__s_00;
  ulong uVar8;
  undefined8 uStack_50;
  undefined1 *local_48;
  size_t local_40;
  uint local_34;
  
  iVar6 = 0;
  if (index < length) {
    local_48 = (undefined1 *)&local_48;
    if ((arr != (int *)0x0) && (iVar6 = 0, -1 < index)) {
      uVar8 = (ulong)(target + 1);
      uVar3 = uVar8 * 4 + 0xf & 0xfffffffffffffff0;
      __s = (undefined4 *)((long)&local_48 - uVar3);
      __s_00 = (undefined4 *)((long)__s - uVar3);
      local_40 = uVar8 * 4;
      local_34 = length;
      *(undefined8 *)(__s_00 + -2) = 0x10e774;
      memset(__s,0,uVar8 * 4);
      __n = local_40;
      *(undefined8 *)(__s_00 + -2) = 0x10e782;
      memset(__s_00,0,__n);
      *__s = 1;
      if (0 < (int)local_34) {
        bVar4 = false;
        uVar3 = (ulong)local_34;
        do {
          uVar1 = uVar3 - 1;
          if (-1 < target) {
            uVar5 = 0;
            do {
              iVar6 = 0;
              if (bVar4) {
                if (-1 < (int)((uint)-arr[uVar1] + uVar5)) {
                  iVar6 = __s[(uint)-arr[uVar1] + uVar5 & 0xffffffff];
                }
                iVar6 = iVar6 + __s_00[uVar5];
                puVar7 = __s;
              }
              else {
                if (-1 < (int)((uint)-arr[uVar1] + uVar5)) {
                  iVar6 = __s_00[(uint)-arr[uVar1] + uVar5 & 0xffffffff];
                }
                iVar6 = iVar6 + __s[uVar5];
                puVar7 = __s_00;
              }
              puVar7[uVar5] = iVar6;
              uVar5 = uVar5 + 1;
            } while (uVar8 != uVar5);
          }
          bVar4 = (bool)(bVar4 ^ 1);
          bVar2 = 1 < (long)uVar3;
          uVar3 = uVar1;
        } while (bVar2);
        if ((local_34 & 1) != 0) {
          __s = __s_00;
        }
      }
      iVar6 = __s[target];
    }
  }
  return iVar6;
}

Assistant:

int DP::save_money_dp(int *arr, int length, int index, int target) {
        if (arr == nullptr || index < 0 || index >= length)
            return 0;

        int res_arr1[target + 1];
        int res_arr2[target + 1];
        memset(res_arr1,0, sizeof(res_arr1));
        memset(res_arr2,0, sizeof(res_arr2));
        bool is_first_main = false;
        res_arr1[0] = 1;

        for (int i = length - 1 ; i >= 0 ; --i) {
            for (int j = 0; j <= target; ++j) {
                if (is_first_main)
                    res_arr1[j] = res_arr2[j] + (j - arr[i] < 0 ? 0 : res_arr1[j - arr[i]]);
                else
                    res_arr2[j] = res_arr1[j] + (j - arr[i] < 0 ? 0:  res_arr2[j - arr[i]]);
            }

            is_first_main = !is_first_main;
        }

        return is_first_main ? res_arr2[target] : res_arr1[target];
    }